

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoSimdUnop<double,double>(Thread *this,UnopFunc<double,_double> *f)

{
  Simd<double,_(unsigned_char)__x02_> val;
  SR result;
  double local_38 [2];
  Value local_28;
  
  local_38 = (double  [2])Pop<wabt::interp::Simd<double,(unsigned_char)2>>(this);
  std::transform<double*,double*,double(*)(double)>
            (local_38,(double *)&local_28.f32_,(double *)&local_28.f32_,f);
  Push(this,local_28);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdUnop(UnopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  auto val = Pop<ST>();
  SR result;
  std::transform(std::begin(val.v), std::end(val.v), std::begin(result.v), f);
  Push(result);
  return RunResult::Ok;
}